

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,expression_statement *s)

{
  expression *e;
  expression_statement *s_local;
  print_visitor *this_local;
  
  e = expression_statement::e(s);
  accept<mjs::print_visitor>(e,this);
  std::operator<<(this->os_,';');
  return;
}

Assistant:

void operator()(const expression_statement& s) {
        accept(s.e(), *this);
        os_ << ';';
    }